

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O3

mspace create_mspace_with_base(void *base,size_t capacity,int locked)

{
  mstate pmVar1;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  if ((capacity < 0x401) || (-mparams.page_size - 0x400 <= capacity)) {
    pmVar1 = (mstate)0x0;
  }
  else {
    pmVar1 = init_user_mstate((char *)base,capacity);
    (pmVar1->seg).sflags = 8;
  }
  return pmVar1;
}

Assistant:

mspace create_mspace_with_base(void* base, size_t capacity, int locked) {
  mstate m = 0;
  size_t msize;
  ensure_initialization();
  msize = pad_request(sizeof(struct malloc_state));
  if (capacity > msize + TOP_FOOT_SIZE &&
      capacity < (size_t) -(msize + TOP_FOOT_SIZE + mparams.page_size)) {
    m = init_user_mstate((char*)base, capacity);
    m->seg.sflags = EXTERN_BIT;
    set_lock(m, locked);
  }
  return (mspace)m;
}